

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::TestCaseTracking::TrackerBase::TrackerHasName::operator()
          (TrackerHasName *this,Ptr<Catch::TestCaseTracking::ITracker> *tracker)

{
  __type_conflict _Var1;
  ITracker *pIVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Ptr<Catch::TestCaseTracking::ITracker> *local_18;
  Ptr<Catch::TestCaseTracking::ITracker> *tracker_local;
  TrackerHasName *this_local;
  
  local_18 = tracker;
  tracker_local = (Ptr<Catch::TestCaseTracking::ITracker> *)this;
  pIVar2 = Ptr<Catch::TestCaseTracking::ITracker>::operator->(tracker);
  (*(pIVar2->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable[4])
            (&local_38);
  _Var1 = std::operator==(&local_38,&this->m_name);
  std::__cxx11::string::~string((string *)&local_38);
  return _Var1;
}

Assistant:

bool operator ()( Ptr<ITracker> const& tracker ) {
                return tracker->name() == m_name;
            }